

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_fopen(FILE **ppFile,char *pFilePath,char *pOpenMode)

{
  FILE *pFVar1;
  int *piVar2;
  char *in_RDX;
  char *in_RSI;
  long *in_RDI;
  ma_result result;
  undefined4 local_24;
  undefined4 local_4;
  
  if (in_RDI != (long *)0x0) {
    *in_RDI = 0;
  }
  if (((in_RSI == (char *)0x0) || (in_RDX == (char *)0x0)) || (in_RDI == (long *)0x0)) {
    local_4 = MA_INVALID_ARGS;
  }
  else {
    pFVar1 = fopen(in_RSI,in_RDX);
    *in_RDI = (long)pFVar1;
    if (*in_RDI == 0) {
      piVar2 = __errno_location();
      local_24 = ma_result_from_errno(*piVar2);
      if (local_24 == MA_SUCCESS) {
        local_24 = MA_ERROR;
      }
      local_4 = local_24;
    }
    else {
      local_4 = MA_SUCCESS;
    }
  }
  return local_4;
}

Assistant:

MA_API ma_result ma_fopen(FILE** ppFile, const char* pFilePath, const char* pOpenMode)
{
#if defined(_MSC_VER) && _MSC_VER >= 1400
    errno_t err;
#endif

    if (ppFile != NULL) {
        *ppFile = NULL;  /* Safety. */
    }

    if (pFilePath == NULL || pOpenMode == NULL || ppFile == NULL) {
        return MA_INVALID_ARGS;
    }

#if defined(_MSC_VER) && _MSC_VER >= 1400
    err = fopen_s(ppFile, pFilePath, pOpenMode);
    if (err != 0) {
        return ma_result_from_errno(err);
    }
#else
#if defined(_WIN32) || defined(__APPLE__)
    *ppFile = fopen(pFilePath, pOpenMode);
#else
    #if defined(_FILE_OFFSET_BITS) && _FILE_OFFSET_BITS == 64 && defined(_LARGEFILE64_SOURCE)
        *ppFile = fopen64(pFilePath, pOpenMode);
    #else
        *ppFile = fopen(pFilePath, pOpenMode);
    #endif
#endif
    if (*ppFile == NULL) {
        ma_result result = ma_result_from_errno(errno);
        if (result == MA_SUCCESS) {
            result = MA_ERROR;   /* Just a safety check to make sure we never ever return success when pFile == NULL. */
        }

        return result;
    }
#endif

    return MA_SUCCESS;
}